

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O0

char * mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t mnemonic_len_1;
  size_t idx_1;
  char *out;
  size_t mnemonic_len;
  size_t idx;
  char *str;
  size_t str_len;
  size_t i;
  size_t total_mnemonics;
  size_t total_bits;
  size_t bytes_len_local;
  uchar *bytes_local;
  words *w_local;
  
  uVar1 = (bytes_len << 3) / w->bits;
  str = (char *)0x0;
  idx = 0;
  for (str_len = 0; str_len < uVar1; str_len = str_len + 1) {
    sVar2 = extract_index(w->bits,bytes,str_len);
    sVar3 = strlen(w->indices[sVar2]);
    str = str + sVar3 + 1;
  }
  if (str != (char *)0x0) {
    idx = (size_t)wally_malloc((size_t)str);
    if ((void *)idx != (void *)0x0) {
      idx_1 = idx;
      for (str_len = 0; str_len < uVar1; str_len = str_len + 1) {
        sVar2 = extract_index(w->bits,bytes,str_len);
        sVar3 = strlen(w->indices[sVar2]);
        memcpy((void *)idx_1,w->indices[sVar2],sVar3);
        *(undefined1 *)(idx_1 + sVar3) = 0x20;
        idx_1 = sVar3 + 1 + idx_1;
      }
      *(char *)(idx + (long)(str + -1)) = '\0';
    }
  }
  return (char *)idx;
}

Assistant:

char *mnemonic_from_bytes(const struct words *w, const unsigned char *bytes, size_t bytes_len)
{
    size_t total_bits = bytes_len * 8u; /* bits in 'bytes' */
    size_t total_mnemonics = total_bits / w->bits; /* Mnemonics in 'bytes' */
    size_t i, str_len = 0;
    char *str = NULL;

    /* Compute length of result */
    for (i = 0; i < total_mnemonics; ++i) {
        size_t idx = extract_index(w->bits, bytes, i);
        size_t mnemonic_len = strlen(w->indices[idx]);

        str_len += mnemonic_len + 1; /* +1 for following separator or NUL */
    }

    /* Allocate and fill result */
    if (str_len && (str = wally_malloc(str_len))) {
        char *out = str;

        for (i = 0; i < total_mnemonics; ++i) {
            size_t idx = extract_index(w->bits, bytes, i);
            size_t mnemonic_len = strlen(w->indices[idx]);

            memcpy(out, w->indices[idx], mnemonic_len);
            out[mnemonic_len] = ' '; /* separator */
            out += mnemonic_len + 1;
        }
        str[str_len - 1] = '\0'; /* Overwrite the last separator with NUL */
    }

    return str;
}